

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall
helics::apps::Player::addEndpoint(Player *this,string_view endpointName,string_view endpointType)

{
  iterator iVar1;
  size_type sVar2;
  size_type sVar3;
  string *psVar4;
  mapped_type *pmVar5;
  _Elt_pointer pEVar6;
  InterfaceVisibility local_4c;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  key_type local_38;
  key_type local_28;
  
  local_48._M_str = endpointType._M_str;
  local_48._M_len = endpointType._M_len;
  local_38._M_str = endpointName._M_str;
  local_38._M_len = endpointName._M_len;
  iVar1 = CLI::std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->eptids)._M_h,&local_38);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Endpoint already exists\n");
    return;
  }
  if ((this->super_App).useLocal != false) {
    sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&local_38,"./",0);
    if (sVar2 == 0xffffffffffffffff) {
      local_28._M_len =
           (size_t)(this->super_App).fed.
                   super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
      emplace_back<helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,
                 (CombinationFederate **)&local_28,&local_38,&local_48);
      goto LAB_00168143;
    }
  }
  local_4c = GLOBAL;
  local_28._M_len =
       (size_t)(this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
  emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,&local_4c,
             (CombinationFederate **)&local_28,&local_38,&local_48);
LAB_00168143:
  sVar3 = CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::size
                    (&this->endpoints);
  pEVar6 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar6 == (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pEVar6 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  psVar4 = Interface::getName_abi_cxx11_(&pEVar6[-1].super_Interface);
  local_28._M_str = (psVar4->_M_dataplus)._M_p;
  local_28._M_len = psVar4->_M_string_length;
  pmVar5 = CLI::std::__detail::
           _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->eptids,&local_28);
  *pmVar5 = (int)sVar3 + -1;
  return;
}

Assistant:

void Player::addEndpoint(std::string_view endpointName, std::string_view endpointType)
{
    // skip already existing publications
    if (eptids.find(endpointName) != eptids.end()) {
        std::cerr << "Endpoint already exists\n";
        return;
    }
    if (!useLocal) {
        endpoints.emplace_back(helics::InterfaceVisibility::GLOBAL,
                               fed.get(),
                               endpointName,
                               endpointType);
    } else {
        auto kp = endpointName.find_first_of("./");
        if (kp == std::string::npos) {
            endpoints.emplace_back(fed.get(), endpointName, endpointType);
        } else {
            endpoints.emplace_back(helics::InterfaceVisibility::GLOBAL,
                                   fed.get(),
                                   endpointName,
                                   endpointType);
        }
    }
    eptids[endpoints.back().getName()] = static_cast<int>(endpoints.size()) - 1;
}